

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_InvalidCallArg_Test::TestBody(ExprTest_InvalidCallArg_Test *this)

{
  bool bVar1;
  Function func;
  ExprFactory *this_00;
  char *message;
  StringRef name;
  CallExprBuilder CVar2;
  AssertHelper AStack_68;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  BasicIteratedExprBuilder<mp::CallExpr> local_30;
  
  this_00 = &(this->super_ExprTest).factory_;
  name.size_ = 3;
  name.data_ = "foo";
  func = mp::BasicExprFactory<std::allocator<char>_>::AddFunction(this_00,name,1,NUMERIC);
  CVar2 = mp::BasicExprFactory<std::allocator<char>_>::BeginCall(this_00,func,1);
  local_30.impl_ = CVar2.impl_;
  local_30.arg_index_ = CVar2.arg_index_;
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid argument",(allocator<char> *)&AStack_68);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
                (&local_30,(Arg)0x0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [115])
               "Expected: builder.AddArg(NumericExpr()) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x153,
             message);
  testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_68);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprTest, InvalidCallArg) {
  mp::Function f = factory_.AddFunction("foo", 1);
  auto builder = factory_.BeginCall(f, 1);
  EXPECT_ASSERT(builder.AddArg(NumericExpr()), "invalid argument");
}